

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pelelm_prob.cpp
# Opt level: O1

void amrex_probinit(int *param_1,int *param_2,int *param_3,amrex_real *param_4,amrex_real *param_5)

{
  ParmParse pp;
  string local_88;
  ParmParse local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"prob","");
  amrex::ParmParse::ParmParse(&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  amrex::ParmParse::query(&local_68,"P_mean",&PeleLM::prob_parm->P_mean,0);
  amrex::ParmParse::query(&local_68,"standoff",&PeleLM::prob_parm->standoff,0);
  amrex::ParmParse::query(&local_68,"pertmag",&PeleLM::prob_parm->pertmag,0);
  pele::physics::PMF::PmfData::initialize(&PeleLM::pmf_data);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_68);
  return;
}

Assistant:

void amrex_probinit (const int* /*init*/,
                         const int* /*name*/,
                         const int* /*namelen*/,
                         const amrex_real* /*problo*/,
                         const amrex_real* /*probhi*/)
    {
        amrex::ParmParse pp("prob");

        pp.query("P_mean",   PeleLM::prob_parm->P_mean);
        pp.query("standoff", PeleLM::prob_parm->standoff);
        pp.query("pertmag",  PeleLM::prob_parm->pertmag);

        PeleLM::pmf_data.initialize();
    }